

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O2

int doDeregisterArchiver(size_t idx)

{
  PHYSFS_ArchiveInfo *pPVar1;
  PHYSFS_Archiver *arc;
  size_t sVar2;
  int iVar3;
  size_t __n;
  
  sVar2 = numArchivers;
  pPVar1 = archiveInfo[idx];
  arc = archivers[idx];
  iVar3 = archiverInUse(arc,searchPath);
  if ((iVar3 == 0) && (iVar3 = archiverInUse(arc,writeDir), iVar3 == 0)) {
    __n = (sVar2 - idx) * 8;
    (*__PHYSFS_AllocatorHooks.Free)(pPVar1->extension);
    (*__PHYSFS_AllocatorHooks.Free)(pPVar1->description);
    (*__PHYSFS_AllocatorHooks.Free)(pPVar1->author);
    (*__PHYSFS_AllocatorHooks.Free)(pPVar1->url);
    (*__PHYSFS_AllocatorHooks.Free)(arc);
    memmove(archiveInfo + idx,archiveInfo + idx + 1,__n);
    memmove(archivers + idx,archivers + idx + 1,__n);
    if (numArchivers != 0) {
      numArchivers = numArchivers - 1;
      return 1;
    }
    __assert_fail("numArchivers > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jarikomppa[P]physfs_magicstream/src/physfs.c"
                  ,0x537,"int doDeregisterArchiver(const size_t)");
  }
  PHYSFS_setErrorCode(PHYSFS_ERR_FILES_STILL_OPEN);
  return 0;
}

Assistant:

static int doDeregisterArchiver(const size_t idx)
{
    const size_t len = (numArchivers - idx) * sizeof (void *);
    PHYSFS_ArchiveInfo *info = archiveInfo[idx];
    PHYSFS_Archiver *arc = archivers[idx];

    /* make sure nothing is still using this archiver */
    if (archiverInUse(arc, searchPath) || archiverInUse(arc, writeDir))
        BAIL(PHYSFS_ERR_FILES_STILL_OPEN, 0);

    allocator.Free((void *) info->extension);
    allocator.Free((void *) info->description);
    allocator.Free((void *) info->author);
    allocator.Free((void *) info->url);
    allocator.Free((void *) arc);

    memmove(&archiveInfo[idx], &archiveInfo[idx+1], len);
    memmove(&archivers[idx], &archivers[idx+1], len);

    assert(numArchivers > 0);
    numArchivers--;

    return 1;
}